

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name)

{
  bool bVar1;
  Tables *pTVar2;
  Symbol SVar3;
  Mutex *local_78;
  undefined4 uStack_64;
  undefined4 uStack_54;
  MutexLockMaybe local_38;
  MutexLockMaybe lock;
  string *name_local;
  DescriptorPool *pool_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  if (pool == this->pool_) {
    local_78 = (Mutex *)0x0;
  }
  else {
    local_78 = pool->mutex_;
  }
  lock.mu_ = (Mutex *)name;
  internal::MutexLockMaybe::MutexLockMaybe(&local_38,local_78);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&pool->tables_);
  SVar3 = DescriptorPool::Tables::FindSymbol(pTVar2,(string *)lock.mu_);
  result._0_8_ = SVar3.field_1;
  this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar3.type);
  bVar1 = anon_unknown_1::Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) && (pool->underlay_ != (DescriptorPool *)0x0)) {
    SVar3 = FindSymbolNotEnforcingDepsHelper(this,pool->underlay_,(string *)lock.mu_);
    result._0_8_ = SVar3.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(uStack_54,SVar3.type);
  }
  bVar1 = anon_unknown_1::Symbol::IsNull((Symbol *)&this_local);
  if ((bVar1) &&
     (bVar1 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,(string *)lock.mu_), bVar1)) {
    pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                       (&pool->tables_);
    SVar3 = DescriptorPool::Tables::FindSymbol(pTVar2,(string *)lock.mu_);
    result._0_8_ = SVar3.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(uStack_64,SVar3.type);
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  SVar3._0_8_ = (ulong)this_local & 0xffffffff;
  SVar3.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)result._0_8_;
  return SVar3;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // In theory, we shouldn't need to check fallback_database_ because the
    // symbol should be in one of its file's direct dependencies, and we have
    // already loaded those by the time we get here.  But we check anyway so
    // that we can generate better error message when dependencies are missing
    // (i.e., "missing dependency" rather than "type is not defined").
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}